

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Exception::Type,_kj::Exception::Type> *params)

{
  undefined4 in_register_00000014;
  ArrayDisposer **local_b0;
  undefined1 local_48 [8];
  String argValues [1];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  argValues[0].content.disposer = (ArrayDisposer *)macroArgs;
  str<kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&>
            ((String *)local_48,(kj *)params,
             (DebugComparison<kj::Exception::Type,_kj::Exception::Type> *)
             CONCAT44(in_register_00000014,line));
  arrayPtr<kj::String>((String *)local_48,1);
  init(this,(EVP_PKEY_CTX *)file);
  local_b0 = &argValues[0].content.disposer;
  do {
    local_b0 = local_b0 + -3;
    String::~String((String *)local_b0);
  } while (local_b0 != (ArrayDisposer **)local_48);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}